

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void processILibs(string *config,cmGeneratorTarget *headTarget,cmLinkItem *item,
                 cmGlobalGenerator *gg,
                 vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *tgts
                 ,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *emitted)

{
  bool bVar1;
  cmLinkInterfaceLibraries *this;
  reference item_00;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar2;
  byte local_81;
  cmLinkItem *lib;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  cmLinkInterfaceLibraries *iface;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *tgts_local;
  cmGlobalGenerator *gg_local;
  cmLinkItem *item_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  
  local_81 = 0;
  if (item->Target != (cmGeneratorTarget *)0x0) {
    pVar2 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(emitted,&item->Target);
    local_81 = pVar2.second;
  }
  if ((local_81 & 1) != 0) {
    std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
              (tgts,&item->Target);
    this = cmGeneratorTarget::GetLinkInterfaceLibraries(item->Target,config,headTarget,true);
    if (this != (cmLinkInterfaceLibraries *)0x0) {
      __end3 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this->Libraries);
      lib = (cmLinkItem *)
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this->Libraries);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                         *)&lib), bVar1) {
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&__end3);
        processILibs(config,headTarget,item_00,gg,tgts,emitted);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

void processILibs(const std::string& config,
                  cmGeneratorTarget const* headTarget, cmLinkItem const& item,
                  cmGlobalGenerator* gg,
                  std::vector<cmGeneratorTarget const*>& tgts,
                  std::set<cmGeneratorTarget const*>& emitted)
{
  if (item.Target && emitted.insert(item.Target).second) {
    tgts.push_back(item.Target);
    if (cmLinkInterfaceLibraries const* iface =
          item.Target->GetLinkInterfaceLibraries(config, headTarget, true)) {
      for (cmLinkItem const& lib : iface->Libraries) {
        processILibs(config, headTarget, lib, gg, tgts, emitted);
      }
    }
  }
}